

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squared_loss_test.cc
# Opt level: O0

void __thiscall xLearn::SQUARED_LOSS_Evaluate_Test::TestBody(SQUARED_LOSS_Evaluate_Test *this)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  void *pvVar6;
  vector<float,_std::allocator<float>_> *this_00;
  char *message;
  float fVar7;
  AssertionResult gtest_ar;
  real_t val;
  ThreadPool *pool;
  size_t threadNumber;
  Score *score;
  SquaredLoss loss;
  int i_1;
  vector<float,_std::allocator<float>_> label;
  int i;
  vector<float,_std::allocator<float>_> pred;
  vector<float,_std::allocator<float>_> *in_stack_00000140;
  vector<float,_std::allocator<float>_> *in_stack_00000148;
  SquaredLoss *in_stack_00000150;
  float in_stack_00000288;
  float in_stack_0000028c;
  char *in_stack_00000290;
  char *in_stack_00000298;
  FMScore *in_stack_fffffffffffffed0;
  allocator_type *in_stack_fffffffffffffee0;
  size_type in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined1 *threads;
  undefined4 in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff14;
  AssertHelper local_d0;
  Message local_c8;
  AssertionResult local_c0;
  real_t local_ac;
  vector<float,_std::allocator<float>_> *local_a8;
  ulong local_a0;
  void *local_98;
  Loss local_90;
  int local_58;
  undefined1 local_51;
  vector<float,_std::allocator<float>_> local_50;
  int local_38;
  vector<float,_std::allocator<float>_> local_20;
  
  std::allocator<float>::allocator((allocator<float> *)0x1849ec);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),in_stack_fffffffffffffee8
             ,in_stack_fffffffffffffee0);
  std::allocator<float>::~allocator((allocator<float> *)0x184a12);
  for (local_38 = 0; uVar3 = (ulong)local_38,
      sVar4 = std::vector<float,_std::allocator<float>_>::size(&local_20), uVar3 < sVar4;
      local_38 = local_38 + 1) {
    in_stack_ffffffffffffff14 = (float)local_38;
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](&local_20,(long)local_38);
    *pvVar5 = in_stack_ffffffffffffff14;
  }
  threads = &local_51;
  std::allocator<float>::allocator((allocator<float> *)0x184ac8);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),in_stack_fffffffffffffee8
             ,in_stack_fffffffffffffee0);
  std::allocator<float>::~allocator((allocator<float> *)0x184aee);
  for (local_58 = 0; uVar3 = (ulong)local_58,
      sVar4 = std::vector<float,_std::allocator<float>_>::size(&local_50), uVar3 < sVar4;
      local_58 = local_58 + 1) {
    fVar7 = (float)(local_58 << 1);
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](&local_50,(long)local_58);
    *pvVar5 = fVar7;
  }
  SquaredLoss::SquaredLoss((SquaredLoss *)in_stack_fffffffffffffed0);
  pvVar6 = operator_new(0x58);
  FMScore::FMScore(in_stack_fffffffffffffed0);
  local_98 = pvVar6;
  uVar2 = std::thread::hardware_concurrency();
  local_a0 = (ulong)uVar2;
  this_00 = (vector<float,_std::allocator<float>_> *)operator_new(0x120);
  ThreadPool::ThreadPool
            ((ThreadPool *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             (size_t)threads);
  local_a8 = this_00;
  Loss::Initialize((Loss *)label.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish,
                   (Score *)label.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,_i_1,(bool)loss.super_Loss._55_1_,
                   (bool)loss.super_Loss._54_1_,loss.super_Loss.batch_size_);
  SquaredLoss::Evaluate(in_stack_00000150,in_stack_00000148,in_stack_00000140);
  local_ac = Loss::GetLoss(&local_90);
  testing::internal::CmpHelperFloatingPointEQ<float>
            (in_stack_00000298,in_stack_00000290,in_stack_0000028c,in_stack_00000288);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x184d66);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/squared_loss_test.cc"
               ,0x33,message);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::Message::~Message((Message *)0x184db4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x184e00);
  SquaredLoss::~SquaredLoss((SquaredLoss *)0x184e0d);
  std::vector<float,_std::allocator<float>_>::~vector(this_00);
  std::vector<float,_std::allocator<float>_>::~vector(this_00);
  return;
}

Assistant:

TEST(SQUARED_LOSS, Evaluate) {
  // Create pred vector
  std::vector<real_t> pred(kLine);
  for (int i = 0; i < pred.size(); ++i) {
    pred[i] = i;
  }
  // Create label vector
  std::vector<real_t> label(kLine);
  for (int i = 0; i < label.size(); ++i) {
    label[i] = 2*i;
  }
  // Create loss
  SquaredLoss loss;
  Score* score = new FMScore;
  size_t threadNumber = std::thread::hardware_concurrency();
  ThreadPool* pool = new ThreadPool(threadNumber);
  loss.Initialize(score, pool);
  loss.Evaluate(pred, label);
  real_t val = loss.GetLoss();
  EXPECT_FLOAT_EQ(val, 14.25);
}